

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase::testCaseStarting(StreamingReporterBase *this,TestCaseInfo *_testInfo)

{
  Option<Catch::TestCaseInfo> *in_stack_fffffffffffffef8;
  Option<Catch::TestCaseInfo> *in_stack_ffffffffffffff00;
  
  Option<Catch::TestCaseInfo>::Option
            (in_stack_ffffffffffffff00,(TestCaseInfo *)in_stack_fffffffffffffef8);
  Option<Catch::TestCaseInfo>::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  Option<Catch::TestCaseInfo>::~Option((Option<Catch::TestCaseInfo> *)0x1808f8);
  return;
}

Assistant:

virtual void testCaseStarting( TestCaseInfo const& _testInfo ) {
            unusedTestCaseInfo = _testInfo;
        }